

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

IString __thiscall wasm::Wasm2JSBuilder::fromName(Wasm2JSBuilder *this,Name name,NameScope scope)

{
  char *pcVar1;
  long *plVar2;
  iterator iVar3;
  IString *this_00;
  size_type sVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  undefined4 in_register_0000000c;
  char *pcVar7;
  int iVar8;
  string_view s;
  Name name_00;
  char *local_248;
  ostringstream out;
  ios_base local_1d8 [264];
  string local_d0;
  ostream *local_b0;
  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_a8;
  char *local_a0;
  long *local_98 [2];
  long local_88 [2];
  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_78;
  undefined1 local_70 [8];
  string mangled;
  __node_gen_type __node_gen;
  char *pcStack_40;
  
  pcVar7 = (char *)CONCAT44(in_register_0000000c,scope);
  local_248 = name.super_IString.str._M_str;
  local_a0 = local_248;
  iVar3 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this->wasmNameToMangledName[(int)scope]._M_h,&local_248);
  pcVar1 = local_a0;
  if (iVar3.super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>._M_cur !=
      (__node_type *)0x0) {
    return (IString)*(string_view *)
                     ((long)iVar3.
                            super__Node_iterator_base<std::pair<const_void_*const,_wasm::IString>,_false>
                            ._M_cur + 0x10);
  }
  local_78 = &this->mangledNames[(int)scope]._M_h;
  local_a8 = &this->mangledNames[1]._M_h;
  ___node_gen = (string_view)ZEXT816(0);
  iVar8 = 0;
  local_b0 = name.super_IString.str._M_len;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_248);
    name_00.super_IString.str._M_str = pcVar7;
    name_00.super_IString.str._M_len = (size_t)pcVar1;
    wasm::operator<<((wasm *)&local_248,local_b0,name_00);
    if (iVar8 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_248,"_",1);
      std::ostream::operator<<((ostringstream *)&local_248,iVar8);
    }
    std::__cxx11::stringbuf::str();
    asmangle((string *)local_70,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_70,mangled._M_dataplus._M_p + (long)local_70);
    plVar2 = local_98[0];
    this_00 = (IString *)strlen((char *)local_98[0]);
    s._M_str = (char *)0x0;
    s._M_len = (size_t)plVar2;
    ___node_gen = IString::interned(this_00,s,SUB81(pcVar7,0));
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    sVar4 = std::
            _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(local_78,(key_type *)&__node_gen);
    if (sVar4 == 0) {
      if ((scope != Local) ||
         (sVar4 = std::
                  _Hashtable<wasm::IString,_wasm::IString,_std::allocator<wasm::IString>,_std::__detail::_Identity,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(local_a8,(key_type *)&__node_gen), sVar4 == 0)) {
        mangled.field_2._8_8_ = local_78;
        std::
        _Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::IString_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::IString,true>>>>
                  ((_Hashtable<wasm::IString,wasm::IString,std::allocator<wasm::IString>,std::__detail::_Identity,std::equal_to<wasm::IString>,std::hash<wasm::IString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_78,&__node_gen);
        mangled.field_2._8_8_ = pcVar1;
        pmVar6 = std::__detail::
                 _Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_wasm::IString>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->wasmNameToMangledName[(int)scope]._M_h,
                              (key_type *)((long)&mangled.field_2 + 8));
        (pmVar6->str)._M_len = (size_t)__node_gen._M_h;
        (pmVar6->str)._M_str = pcStack_40;
        if (local_70 != (undefined1  [8])&mangled._M_string_length) {
          operator_delete((void *)local_70,mangled._M_string_length + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_248);
        std::ios_base::~ios_base(local_1d8);
        return (IString)___node_gen;
      }
    }
    else if (scope == Export) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"wasm2js: warning: export names colliding: ",0x2a);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_70,(long)mangled._M_dataplus._M_p);
      mangled.field_2._M_local_buf[8] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,mangled.field_2._M_local_buf + 8,1);
    }
    if (local_70 != (undefined1  [8])&mangled._M_string_length) {
      operator_delete((void *)local_70,mangled._M_string_length + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_248);
    std::ios_base::~ios_base(local_1d8);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

IString fromName(Name name, NameScope scope) {
    // TODO: checking names do not collide after mangling

    // First up check our cached of mangled names to avoid doing extra work
    // below
    auto& map = wasmNameToMangledName[(int)scope];
    auto it = map.find(name.str.data());
    if (it != map.end()) {
      return it->second;
    }
    // The mangled names in our scope.
    auto& scopeMangledNames = mangledNames[(int)scope];
    // In some cases (see below) we need to also check the Top scope.
    auto& topMangledNames = mangledNames[int(NameScope::Top)];

    // This is the first time we've seen the `name` and `scope` pair. Generate a
    // globally unique name based on `name` and then register that in our cache
    // and return it.
    //
    // Identifiers here generated are of the form `${name}_${n}` where `_${n}`
    // is omitted if `n==0` and otherwise `n` is just looped over to find the
    // next unused identifier.
    IString ret;
    for (int i = 0;; i++) {
      std::ostringstream out;
      out << name;
      if (i > 0) {
        out << "_" << i;
      }
      auto mangled = asmangle(out.str());
      ret = stringToIString(mangled);
      if (scopeMangledNames.count(ret)) {
        // When export names collide things may be confusing, as this is
        // observable externally by the person using the JS. Report a warning.
        if (scope == NameScope::Export) {
          std::cerr << "wasm2js: warning: export names colliding: " << mangled
                    << '\n';
        }
        continue;
      }
      // The Local scope is special: a Local name must not collide with a Top
      // name, as they are in a single namespace in JS and can conflict:
      //
      // function foo(bar) {
      //   var bar = 0;
      // }
      // function bar() { ..
      if (scope == NameScope::Local && topMangledNames.count(ret)) {
        continue;
      }
      // We found a good name, use it.
      scopeMangledNames.insert(ret);
      map[name.str.data()] = ret;
      return ret;
    }
  }